

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_pubkey_ok_ed25519_mem.c
# Opt level: O1

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  
  iVar1 = test_auth_pubkey(session,2,"libssh2",(char *)0x0,(char *)0x0,"key_ed25519");
  return iVar1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
#if LIBSSH2_ED25519
    /* set in Dockerfile */
    return test_auth_pubkey(session, TEST_AUTH_FROMMEM,
                            "libssh2",
                            NULL,
                            NULL,
                            "key_ed25519");
#else
    (void)session;
    return 0;
#endif
}